

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

void nghttp3_qpack_encoder_unblock_stream
               (nghttp3_qpack_encoder *encoder,nghttp3_qpack_stream *stream)

{
  nghttp3_ksl *in_RSI;
  nghttp3_ksl_it it;
  nghttp3_blocked_streams_key bsk;
  nghttp3_ksl_key *in_stack_ffffffffffffffa8;
  nghttp3_ksl *in_stack_ffffffffffffffb0;
  nghttp3_ksl_it *in_stack_ffffffffffffffb8;
  nghttp3_ksl_it *in_stack_ffffffffffffffc0;
  
  nghttp3_pq_top((nghttp3_pq *)0x10d8dc);
  nghttp3_ksl_lower_bound(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (((nghttp3_ksl_it *)(ulong)(uint)in_stack_ffffffffffffffb8->i == in_stack_ffffffffffffffc0) &&
     (in_stack_ffffffffffffffb8->ksl == (nghttp3_ksl *)0x0)) {
    __assert_fail("!nghttp3_ksl_it_end(&it)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                  ,0x8f5,
                  "void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *, nghttp3_qpack_stream *)"
                 );
  }
  if (*(nghttp3_ksl **)
       ((long)&in_stack_ffffffffffffffb8[1].ksl +
       in_stack_ffffffffffffffb0->nodelen * (long)in_stack_ffffffffffffffc0) == in_RSI) {
    nghttp3_ksl_remove_hint
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    return;
  }
  __assert_fail("nghttp3_ksl_it_get(&it) == stream",
                "/workspace/llm4binary/github/license_c_cmakelists/ngtcp2[P]nghttp3/lib/nghttp3_qpack.c"
                ,0x8f6,
                "void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *, nghttp3_qpack_stream *)"
               );
}

Assistant:

void nghttp3_qpack_encoder_unblock_stream(nghttp3_qpack_encoder *encoder,
                                          nghttp3_qpack_stream *stream) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = nghttp3_struct_of(nghttp3_pq_top(&stream->max_cnts),
                                 nghttp3_qpack_header_block_ref, max_cnts_pe)
                 ->max_cnt,
    .id = (uint64_t)stream->stream_id,
  };
  nghttp3_ksl_it it;

  /* This is purely debugging purpose only */
  it = nghttp3_ksl_lower_bound(&encoder->blocked_streams, &bsk);

  assert(!nghttp3_ksl_it_end(&it));
  assert(nghttp3_ksl_it_get(&it) == stream);

  nghttp3_ksl_remove_hint(&encoder->blocked_streams, NULL, &it, &bsk);
}